

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alhelpers.c
# Opt level: O3

int altime_get(void)

{
  int iVar1;
  int iVar2;
  timespec ts;
  timespec local_18;
  
  iVar2 = 0;
  iVar1 = clock_gettime(0,&local_18);
  if (iVar1 == 0) {
    iVar2 = ((int)(SUB168(SEXT816(0x431bde82d7b634db) * SEXT816(local_18.tv_nsec),8) >> 0x12) -
            (SUB164(SEXT816(0x431bde82d7b634db) * SEXT816(local_18.tv_nsec),0xc) >> 0x1f)) +
            (int)local_18.tv_sec * 1000;
    if (altime_get::start_time == 0) {
      altime_get::start_time = iVar2;
    }
    iVar2 = iVar2 - altime_get::start_time;
  }
  return iVar2;
}

Assistant:

int altime_get(void)
{
    static int start_time = 0u;
    int cur_time;

#if _POSIX_TIMERS > 0
    struct timespec ts;
    int ret = clock_gettime(CLOCK_REALTIME, &ts);
    if(ret != 0) return 0;
    cur_time = (int)(ts.tv_sec*1000 + ts.tv_nsec/1000000);
#else /* _POSIX_TIMERS > 0 */
    struct timeval tv;
    int ret = gettimeofday(&tv, NULL);
    if(ret != 0) return 0;
    cur_time = (int)(tv.tv_sec*1000 + tv.tv_usec/1000);
#endif

    if(!start_time)
        start_time = cur_time;
    return cur_time - start_time;
}